

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

string * __thiscall
flatbuffers::go::GoGenerator::GetEnumTypeName_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,EnumDef *enum_def)

{
  string local_40;
  EnumDef *local_20;
  EnumDef *enum_def_local;
  GoGenerator *this_local;
  
  local_20 = enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (GoGenerator *)__return_storage_ptr__;
  IdlNamer::Type_abi_cxx11_(&local_40,&this->namer_,enum_def);
  WrapInNameSpaceAndTrack(__return_storage_ptr__,this,&enum_def->super_Definition,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumTypeName(const EnumDef &enum_def) {
    return WrapInNameSpaceAndTrack(&enum_def, namer_.Type(enum_def));
  }